

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# token.cc
# Opt level: O0

Token * __thiscall wabt::Token::operator=(Token *this,Token *other)

{
  bool bVar1;
  Token *other_local;
  Token *this_local;
  
  Destroy(this);
  (this->loc).filename.data_ = (other->loc).filename.data_;
  (this->loc).filename.size_ = (other->loc).filename.size_;
  (this->loc).field_1.field_1.offset = (other->loc).field_1.field_1.offset;
  *(undefined8 *)((long)&(this->loc).field_1 + 8) = *(undefined8 *)((long)&(other->loc).field_1 + 8)
  ;
  this->token_type_ = other->token_type_;
  bVar1 = HasLiteral(this);
  if (bVar1) {
    Construct<wabt::Literal,wabt::Literal>(&(this->field_2).literal_,&(other->field_2).literal_);
  }
  else {
    bVar1 = HasOpcode(this);
    if (bVar1) {
      Construct<wabt::Opcode,wabt::Opcode>(&(this->field_2).opcode_,&(other->field_2).opcode_);
    }
    else {
      bVar1 = HasText(this);
      if (bVar1) {
        Construct<std::__cxx11::string,std::__cxx11::string>
                  (&(this->field_2).text_,&(other->field_2).text_);
      }
      else {
        bVar1 = HasType(this);
        if (bVar1) {
          Construct<wabt::Type,wabt::Type>(&(this->field_2).type_,&(other->field_2).type_);
        }
      }
    }
  }
  other->token_type_ = First;
  return this;
}

Assistant:

Token& Token::operator=(Token&& other) {
  Destroy();
  loc = other.loc;
  token_type_ = other.token_type_;

  if (HasLiteral()) {
    Construct(literal_, std::move(other.literal_));
  } else if (HasOpcode()) {
    Construct(opcode_, std::move(other.opcode_));
  } else if (HasText()) {
    Construct(text_, std::move(other.text_));
  } else if (HasType()) {
    Construct(type_, std::move(other.type_));
  }

  other.token_type_ = TokenType::Invalid;

  return *this;
}